

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O2

void olsrv2_routing_set_domain_parameter(nhdp_domain *domain,olsrv2_routing_domain *parameter)

{
  int iVar1;
  undefined3 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  olsrv2_routing_domain *__s2;
  avl_tree *paVar7;
  
  iVar1 = domain->index;
  __s2 = _domain_parameter + iVar1;
  iVar5 = bcmp(parameter,__s2,0x14);
  if (iVar5 != 0) {
    uVar2 = *(undefined3 *)&parameter->field_0x11;
    _domain_parameter[iVar1].source_specific = parameter->source_specific;
    *(undefined3 *)&_domain_parameter[iVar1].field_0x11 = uVar2;
    uVar2 = *(undefined3 *)&parameter->field_0x1;
    iVar5 = parameter->protocol;
    iVar3 = parameter->table;
    iVar4 = parameter->distance;
    __s2->use_srcip_in_routes = parameter->use_srcip_in_routes;
    *(undefined3 *)&__s2->field_0x1 = uVar2;
    __s2->protocol = iVar5;
    _domain_parameter[iVar1].table = iVar3;
    _domain_parameter[iVar1].distance = iVar4;
    uVar6 = (ulong)domain->index;
    if (_routing_tree[uVar6].count != 0) {
      paVar7 = _routing_tree + uVar6;
      do {
        do {
          paVar7 = (avl_tree *)(paVar7->list_head).next;
          if ((paVar7->list_head).prev == _routing_tree[(int)uVar6].list_head.prev) {
            _process_kernel_queue();
            oonf_timer_set_ext(&_rate_limit_timer,100,100);
            _trigger_dijkstra = 1;
            return;
          }
        } while (*(char *)((long)&paVar7[-3].list_head.next + 3) != '\x01');
        *(undefined1 *)((long)&paVar7[-3].list_head.next + 3) = 0;
        if (*(char *)((long)&paVar7[-3].list_head.next + 4) == '\x01') {
          os_routing_linux_interrupt((os_route *)(paVar7 + -9));
          *(undefined1 *)((long)&paVar7[-3].list_head.next + 3) = 0;
        }
        _add_route_to_kernel_queue((olsrv2_routing_entry *)(paVar7 + -9));
        uVar6 = (ulong)(uint)domain->index;
      } while( true );
    }
  }
  return;
}

Assistant:

void
olsrv2_routing_set_domain_parameter(struct nhdp_domain *domain, struct olsrv2_routing_domain *parameter) {
  struct olsrv2_routing_entry *rtentry;

  if (memcmp(parameter, &_domain_parameter[domain->index], sizeof(*parameter)) == 0) {
    /* no change */
    return;
  }

  /* copy parameters */
  memcpy(&_domain_parameter[domain->index], parameter, sizeof(*parameter));

  if (avl_is_empty(&_routing_tree[domain->index])) {
    /* no routes present */
    return;
  }

  /* remove old kernel routes */
  avl_for_each_element(&_routing_tree[domain->index], rtentry, _node) {
    if (rtentry->set) {
      rtentry->set = false;

      if (rtentry->in_processing) {
        os_routing_interrupt(&rtentry->route);
        rtentry->set = false;
      }

      _add_route_to_kernel_queue(rtentry);
    }
  }

  _process_kernel_queue();

  /* trigger a dijkstra to write new routes in 100 milliseconds */
  oonf_timer_set(&_rate_limit_timer, 100);
  _trigger_dijkstra = true;
}